

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

SymbolInfo * __thiscall
ZXing::Pdf417::DetectSymbol<ZXing::PointT<double>>
          (SymbolInfo *__return_storage_ptr__,Pdf417 *this,
          BitMatrixCursor<ZXing::PointT<double>_> topCur,int width,int height)

{
  float fVar1;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  undefined1 auVar2 [16];
  int iVar3;
  int colWidth;
  int in_R8D;
  float fVar4;
  double dVar5;
  ushort uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  PointT<double> rowSkip;
  PointT<double> rowSkip_00;
  array<unsigned_short,_8UL> pat;
  SymbolInfo topSI;
  SymbolInfo botSI;
  undefined8 local_a8;
  double dStack_a0;
  _Type local_98;
  undefined1 local_80 [12];
  int iStack_74;
  Iterator local_70;
  undefined1 auStack_68 [8];
  ulong uStack_60;
  SymbolInfo local_54;
  
  colWidth = (int)this;
  local_80._0_8_ = topCur.img;
  unique0x100000e6 = topCur.p.x - (double)(width / 2) * topCur.d.y;
  local_70 = (Iterator)(topCur.d.x * (double)(width / 2) + topCur.p.y);
  dVar7 = ABS(topCur.d.x);
  dVar5 = ABS(topCur.d.y);
  if (ABS(topCur.d.y) <= dVar7) {
    dVar5 = dVar7;
  }
  auVar8._8_8_ = dVar5;
  auVar8._0_8_ = dVar5;
  auVar8 = divpd((undefined1  [16])topCur.d,auVar8);
  _auStack_68 = auVar8;
  local_98 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                    readPatternFromBlack<std::array<unsigned_short,8ul>>
                              ((BitMatrixCursor<ZXing::PointT<double>> *)local_80,1,colWidth / 3);
  local_80._0_8_ = local_98;
  local_80._8_4_ = 8;
  local_70 = (Iterator)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_60;
  _auStack_68 = auVar2 << 0x40;
  dVar5 = IsPattern<false,8,17>
                    ((PatternView *)local_80,(FixedPattern<8,_17,_false> *)START_PATTERN,0,0.0,0.0);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    uVar6 = local_98[7] + local_98[3] + local_98[5] + local_98[1] +
            local_98[6] + local_98[2] + local_98[4] + local_98[0];
    fVar4 = (float)uVar6 / 17.0;
    fVar1 = 1.0;
    if (1.0 <= fVar4) {
      fVar1 = fVar4;
    }
    if (dVar7 <= ABS(topCur.d.y)) {
      dVar7 = ABS(topCur.d.y);
    }
    dVar5 = (-topCur.d.y / dVar7) * (double)fVar1;
    dVar7 = (topCur.d.x / dVar7) * (double)fVar1;
    rowSkip.y = dVar7;
    rowSkip.x = dVar5;
    ReadSymbolInfo<ZXing::PointT<double>>
              ((SymbolInfo *)local_80,(Pdf417 *)(ulong)(uint)uVar6,topCur,rowSkip,colWidth,width,
               in_R8D);
    local_a8 = auVar8._0_8_;
    dStack_a0 = auVar8._8_8_;
    rowSkip_00.x = -dVar5;
    rowSkip_00.y = -dVar7;
    topCur_00.p.x = topCur.p.x - topCur.d.y * (double)(width + -1);
    topCur_00.img = topCur.img;
    topCur_00.p.y = topCur.d.x * (double)(width + -1) + topCur.p.y;
    topCur_00.d.x = (double)local_a8;
    topCur_00.d.y = dStack_a0;
    ReadSymbolInfo<ZXing::PointT<double>>
              (&local_54,(Pdf417 *)(ulong)uVar6,topCur_00,rowSkip_00,colWidth,width,in_R8D);
    __return_storage_ptr__->rowHeight = (float)uStack_60;
    *(Iterator *)&__return_storage_ptr__->firstRow = local_70;
    __return_storage_ptr__->ecLevel = auStack_68._0_4_;
    __return_storage_ptr__->colWidth = auStack_68._4_4_;
    __return_storage_ptr__->width = local_80._0_4_;
    __return_storage_ptr__->height = local_80._4_4_;
    __return_storage_ptr__->nRows = local_80._8_4_;
    __return_storage_ptr__->nCols = iStack_74;
    __return_storage_ptr__->lastRow = local_54.firstRow;
    local_54.firstRow = local_54.firstRow - __return_storage_ptr__->firstRow;
    iVar3 = -local_54.firstRow;
    if (0 < local_54.firstRow) {
      iVar3 = local_54.firstRow;
    }
    __return_storage_ptr__->rowHeight = (float)width / (float)(iVar3 + 1);
    if (iStack_74 != local_54.nCols) {
      __return_storage_ptr__->nCols =
           (__return_storage_ptr__->colWidth / 2 + colWidth) / __return_storage_ptr__->colWidth + -4
      ;
    }
  }
  else {
    __return_storage_ptr__->width = 0;
    __return_storage_ptr__->height = 0;
    __return_storage_ptr__->nRows = 0;
    __return_storage_ptr__->nCols = 0;
    __return_storage_ptr__->firstRow = -1;
    __return_storage_ptr__->lastRow = -1;
    __return_storage_ptr__->ecLevel = -1;
    __return_storage_ptr__->colWidth = 0;
    __return_storage_ptr__->rowHeight = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

SymbolInfo DetectSymbol(BitMatrixCursor<POINT> topCur, int width, int height)
{
	auto pat = topCur.movedBy(height / 2 * topCur.right()).template readPatternFromBlack<Pattern417>(1, width / 3);
	if (!IsPattern(pat, START_PATTERN))
		return {};
	int colWidth = Reduce(pat);
	auto rowSkip = std::max(colWidth / 17.f, 1.f) * bresenhamDirection(topCur.right());
	auto botCur  = topCur.movedBy((height - 1) * topCur.right());

	auto topSI = ReadSymbolInfo(topCur, rowSkip, colWidth, width, height);
	auto botSI = ReadSymbolInfo(botCur, -rowSkip, colWidth, width, height);

	SymbolInfo res = topSI;
	res.lastRow = botSI.firstRow;
	res.rowHeight = float(height) / (std::abs(res.lastRow - res.firstRow) + 1);
	if (topSI.nCols != botSI.nCols)
		// if there is something fishy with the number of cols (aliasing), guess them from the width
		res.nCols = (width + res.colWidth / 2) / res.colWidth - 4;

	return res;
}